

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<AV1Kmeans::AV1KmeansTest1_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<AV1Kmeans::AV1KmeansTest1_DISABLED_Speed_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int),BLOCK_SIZE>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x4030);
  AV1Kmeans::AV1KmeansTest1_DISABLED_Speed_Test::AV1KmeansTest1_DISABLED_Speed_Test
            ((AV1KmeansTest1_DISABLED_Speed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }